

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceDirWrapper.cpp
# Opt level: O0

QString * __thiscall
ResourceDirWrapper::getFieldName
          (QString *__return_storage_ptr__,ResourceDirWrapper *this,size_t fieldId)

{
  Executable *pEVar1;
  bool bVar2;
  PEFile *local_58;
  PEFile *myPe;
  size_t fieldId_local;
  ResourceDirWrapper *this_local;
  
  switch(fieldId) {
  case 0:
    QString::QString(__return_storage_ptr__,"Characteristics");
    break;
  case 1:
    pEVar1 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
             super_ExeElementWrapper.m_Exe;
    if (pEVar1 == (Executable *)0x0) {
      local_58 = (PEFile *)0x0;
    }
    else {
      local_58 = (PEFile *)__dynamic_cast(pEVar1,&Executable::typeinfo,&PEFile::typeinfo,0);
    }
    if ((local_58 == (PEFile *)0x0) || (bVar2 = PEFile::isReproBuild(local_58), !bVar2)) {
      QString::QString(__return_storage_ptr__,"TimeDateStamp");
    }
    else {
      QString::QString(__return_storage_ptr__,"ReproChecksum");
    }
    break;
  case 2:
    QString::QString(__return_storage_ptr__,"MajorVersion");
    break;
  case 3:
    QString::QString(__return_storage_ptr__,"MinorVersion");
    break;
  case 4:
    QString::QString(__return_storage_ptr__,"NumberOfNamedEntries");
    break;
  case 5:
    QString::QString(__return_storage_ptr__,"NumberOfIdEntries");
    break;
  default:
    (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
      super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xe])
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

QString ResourceDirWrapper::getFieldName(size_t fieldId)
{
    switch (fieldId) {
        case CHARACTERISTIC: return "Characteristics";
        case TIMESTAMP: {
            PEFile* myPe = dynamic_cast<PEFile*>(this->m_Exe);
            if (myPe && myPe->isReproBuild()) {
                return "ReproChecksum";
            }
            return "TimeDateStamp";
        }
        case MAJOR_VER: return "MajorVersion";
        case MINOR_VER: return "MinorVersion";
        case NAMED_ENTRIES_NUM : return "NumberOfNamedEntries";
        case ID_ENTRIES_NUM : return "NumberOfIdEntries";
    }
    return getName();
}